

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O3

uint32 trans_hash_fn(ScanStateTransition *a,hash_fns_t *fns)

{
  uint32 uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  if ((fns->data[0] == (void *)0x0) && (uVar2 = (ulong)(a->live_diff).n, uVar1 = 0, uVar2 != 0)) {
    uVar3 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + (a->live_diff).v[uVar3]->index * 3;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  uVar2 = (ulong)(a->accepts_diff).n;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      uVar1 = uVar1 + (a->accepts_diff).v[uVar3]->index * 3;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return uVar1;
}

Assistant:

static uint32 trans_hash_fn(ScanStateTransition *a, hash_fns_t *fns) {
  uint h = 0, i;

  if (!fns->data[0])
    for (i = 0; i < a->live_diff.n; i++) h += 3 * a->live_diff.v[i]->index;
  for (i = 0; i < a->accepts_diff.n; i++) h += 3 * a->accepts_diff.v[i]->index;
  return h;
}